

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O2

int NAME_CONSTRAINTS_check(X509 *x,NAME_CONSTRAINTS *nc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  anon_union_8_14_bdc3d066_for_d name;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  X509_NAME_ENTRY *ne;
  GENERAL_NAME *gen;
  ulong uVar10;
  GENERAL_NAME gntmp;
  
  name.otherName = (OTHERNAME *)X509_get_subject_name(x);
  iVar3 = X509_NAME_entry_count((X509_NAME *)name.otherName);
  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)x->ex_xkusage);
  sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)nc->permittedSubtrees);
  sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)nc->excludedSubtrees);
  uVar10 = sVar8 + sVar7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar6 + (long)iVar3;
  uVar9 = SUB168(auVar1 * auVar2,0);
  iVar4 = X509_NAME_entry_count((X509_NAME *)name.otherName);
  iVar5 = 1;
  if (((ulong)(long)iVar4 <= sVar6 + (long)iVar3) &&
     (sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)nc->permittedSubtrees), sVar6 <= uVar10)) {
    if (uVar10 == 0) {
      if (0x100000 < uVar9) {
        return 1;
      }
    }
    else if (SUB168(auVar1 * auVar2,8) != 0 || 0x100000 < uVar9) {
      return 1;
    }
    iVar5 = X509_NAME_entry_count((X509_NAME *)name.otherName);
    if (iVar5 < 1) {
LAB_0020328b:
      uVar9 = 0;
      do {
        sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)x->ex_xkusage);
        if (sVar6 <= uVar9) {
          return 0;
        }
        gen = (GENERAL_NAME *)OPENSSL_sk_value((OPENSSL_STACK *)x->ex_xkusage,uVar9);
        iVar5 = nc_match(gen,(NAME_CONSTRAINTS *)nc);
        uVar9 = uVar9 + 1;
      } while (iVar5 == 0);
    }
    else {
      gntmp.type = 4;
      gntmp.d.otherName = name.otherName;
      iVar5 = nc_match(&gntmp,(NAME_CONSTRAINTS *)nc);
      if (iVar5 == 0) {
        gntmp.type = 1;
        iVar3 = -1;
        do {
          iVar3 = X509_NAME_get_index_by_NID((X509_NAME *)name.otherName,0x30,iVar3);
          if (iVar3 == -1) goto LAB_0020328b;
          ne = X509_NAME_get_entry((X509_NAME *)name.otherName,iVar3);
          gntmp.d.otherName = (OTHERNAME *)X509_NAME_ENTRY_get_data(ne);
          iVar5 = 0x35;
        } while (((gntmp.d.rfc822Name)->type == 0x16) &&
                (iVar5 = nc_match(&gntmp,(NAME_CONSTRAINTS *)nc), iVar5 == 0));
      }
    }
  }
  return iVar5;
}

Assistant:

int NAME_CONSTRAINTS_check(X509 *x, NAME_CONSTRAINTS *nc) {
  int r, i;
  size_t j;
  X509_NAME *nm;

  nm = X509_get_subject_name(x);

  // Guard against certificates with an excessive number of names or
  // constraints causing a computationally expensive name constraints
  // check.
  size_t name_count =
      X509_NAME_entry_count(nm) + sk_GENERAL_NAME_num(x->altname);
  size_t constraint_count = sk_GENERAL_SUBTREE_num(nc->permittedSubtrees) +
                            sk_GENERAL_SUBTREE_num(nc->excludedSubtrees);
  size_t check_count = constraint_count * name_count;
  if (name_count < (size_t)X509_NAME_entry_count(nm) ||
      constraint_count < sk_GENERAL_SUBTREE_num(nc->permittedSubtrees) ||
      (constraint_count && check_count / constraint_count != name_count) ||
      check_count > 1 << 20) {
    return X509_V_ERR_UNSPECIFIED;
  }

  if (X509_NAME_entry_count(nm) > 0) {
    GENERAL_NAME gntmp;
    gntmp.type = GEN_DIRNAME;
    gntmp.d.directoryName = nm;

    r = nc_match(&gntmp, nc);

    if (r != X509_V_OK) {
      return r;
    }

    gntmp.type = GEN_EMAIL;

    // Process any email address attributes in subject name

    for (i = -1;;) {
      i = X509_NAME_get_index_by_NID(nm, NID_pkcs9_emailAddress, i);
      if (i == -1) {
        break;
      }
      const X509_NAME_ENTRY *ne = X509_NAME_get_entry(nm, i);
      gntmp.d.rfc822Name = X509_NAME_ENTRY_get_data(ne);
      if (gntmp.d.rfc822Name->type != V_ASN1_IA5STRING) {
        return X509_V_ERR_UNSUPPORTED_NAME_SYNTAX;
      }

      r = nc_match(&gntmp, nc);

      if (r != X509_V_OK) {
        return r;
      }
    }
  }

  for (j = 0; j < sk_GENERAL_NAME_num(x->altname); j++) {
    GENERAL_NAME *gen = sk_GENERAL_NAME_value(x->altname, j);
    r = nc_match(gen, nc);
    if (r != X509_V_OK) {
      return r;
    }
  }

  return X509_V_OK;
}